

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp_scan.hpp
# Opt level: O3

void __thiscall
duckdb::ChimpGroupState<unsigned_int>::LoadLeadingZeros
          (ChimpGroupState<unsigned_int> *this,uint8_t *packed_data,idx_t leading_zero_block_size)

{
  ulong uVar1;
  ulong uVar2;
  
  if (leading_zero_block_size != 0) {
    uVar1 = 0;
    do {
      uVar2 = (ulong)((uint)uVar1 & 7);
      this->leading_zeros[uVar1] =
           *(uint8_t *)
            ((long)&ChimpConstants::Decompression::LEADING_REPRESENTATION +
            (ulong)((*(uint *)(LeadingZeroBufferConstants::MASKS + uVar2 * 4) &
                    *(uint *)(packed_data + (uVar1 >> 3 & 0x1fffffff) * 3)) >>
                    (*(byte *)((long)&LeadingZeroBufferConstants::SHIFTS + uVar2) & 0x1f) & 0xff));
      uVar1 = uVar1 + 1;
    } while (leading_zero_block_size != uVar1);
  }
  this->max_leading_zeros_to_read = leading_zero_block_size;
  this->leading_zero_index = 0;
  return;
}

Assistant:

void LoadLeadingZeros(uint8_t *packed_data, idx_t leading_zero_block_size) {
#ifdef DEBUG
		idx_t flag_one_count = 0;
		for (idx_t i = 0; i < max_flags_to_read; i++) {
			flag_one_count += flags[1 + i] == ChimpConstants::Flags::LEADING_ZERO_LOAD;
		}
		// There are 8 leading zero values packed in one block, the block could be partially filled
		flag_one_count = AlignValue<idx_t, 8>(flag_one_count);
		D_ASSERT(flag_one_count == leading_zero_block_size);
#endif
		LeadingZeroBuffer<false> leading_zero_buffer;
		leading_zero_buffer.SetBuffer(packed_data);
		for (idx_t i = 0; i < leading_zero_block_size; i++) {
			leading_zeros[i] = ChimpConstants::Decompression::LEADING_REPRESENTATION[leading_zero_buffer.Extract()];
		}
		max_leading_zeros_to_read = leading_zero_block_size;
		leading_zero_index = 0;
	}